

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

int solver2_analyze_final(sat_solver2 *s,clause *conf,int skip_first)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  clause *cls;
  
  if (-1 < (s->conf_final).size) {
    (s->conf_final).size = 0;
    if (s->root_level == 0) {
      return s->hProofLast;
    }
    proof_chain_start(s,conf);
    if ((s->tagged).size != 0) {
      __assert_fail("veci_size(&s->tagged) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x271,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
    }
    if (skip_first < (int)((uint)*conf >> 0xb)) {
      lVar6 = (long)skip_first;
      do {
        if ((uint)conf[lVar6 + 1] < 2) break;
        iVar5 = (int)conf[lVar6 + 1] >> 1;
        if (s->levels[iVar5] == 0) {
          proof_chain_resolve(s,(clause *)0x0,iVar5);
        }
        else {
          if (((uint)s->vi[iVar5] & 0x3c) == 0) {
            uVar1 = (s->tagged).cap;
            if ((s->tagged).size == uVar1) {
              iVar7 = (uVar1 >> 1) * 3;
              if ((int)uVar1 < 4) {
                iVar7 = uVar1 * 2;
              }
              piVar4 = (s->tagged).ptr;
              if (piVar4 == (int *)0x0) {
                piVar4 = (int *)malloc((long)iVar7 << 2);
              }
              else {
                piVar4 = (int *)realloc(piVar4,(long)iVar7 << 2);
              }
              (s->tagged).ptr = piVar4;
              if (piVar4 == (int *)0x0) {
                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                       (double)(s->tagged).cap * 9.5367431640625e-07,
                       (double)iVar7 * 9.5367431640625e-07);
                fflush(_stdout);
              }
              (s->tagged).cap = iVar7;
            }
            iVar7 = (s->tagged).size;
            (s->tagged).size = iVar7 + 1;
            (s->tagged).ptr[iVar7] = iVar5;
          }
          *(byte *)(s->vi + iVar5) = *(byte *)(s->vi + iVar5) & 0xc3 | 4;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (long)(ulong)((uint)*conf >> 0xb));
    }
    if (s->root_level < (s->trail_lim).size) {
      __assert_fail("s->root_level >= veci_size(&s->trail_lim)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x278,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
    }
    lVar6 = (long)s->qtail;
    if (*(s->trail_lim).ptr < s->qtail) {
      do {
        uVar1 = s->trail[lVar6 + -1];
        iVar5 = (int)uVar1 >> 1;
        if (((uint)s->vi[iVar5] & 0x3c) != 0) {
          uVar2 = s->reasons[iVar5];
          if (uVar2 == 0) {
            cls = (clause *)0x0;
          }
          else {
            uVar3 = (s->Mem).uPageMask & uVar2;
            if (uVar3 == 0) {
              __assert_fail("k",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satClause.h"
                            ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
            }
            cls = (clause *)
                  ((s->Mem).pPages[(int)uVar2 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar3);
          }
          if (cls == (clause *)0x0) {
            if (s->levels[iVar5] == 0) {
              __assert_fail("var_level(s,x)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x287,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
            }
            uVar2 = (s->conf_final).cap;
            if ((s->conf_final).size == uVar2) {
              iVar5 = (uVar2 >> 1) * 3;
              if ((int)uVar2 < 4) {
                iVar5 = uVar2 * 2;
              }
              piVar4 = (s->conf_final).ptr;
              if (piVar4 == (int *)0x0) {
                piVar4 = (int *)malloc((long)iVar5 << 2);
              }
              else {
                piVar4 = (int *)realloc(piVar4,(long)iVar5 << 2);
              }
              (s->conf_final).ptr = piVar4;
              if (piVar4 == (int *)0x0) {
                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                       (double)(s->conf_final).cap * 9.5367431640625e-07,
                       (double)iVar5 * 9.5367431640625e-07);
                fflush(_stdout);
              }
              (s->conf_final).cap = iVar5;
            }
            iVar5 = (s->conf_final).size;
            (s->conf_final).size = iVar5 + 1;
            (s->conf_final).ptr[iVar5] = uVar1 ^ 1;
          }
          else {
            proof_chain_resolve(s,cls,iVar5);
            if (0xfff < (uint)*cls) {
              uVar8 = 1;
              do {
                if ((uint)cls[uVar8 + 1] < 2) break;
                iVar5 = (int)cls[uVar8 + 1] >> 1;
                if (s->levels[iVar5] == 0) {
                  proof_chain_resolve(s,(clause *)0x0,iVar5);
                }
                else {
                  if (((uint)s->vi[iVar5] & 0x3c) == 0) {
                    uVar1 = (s->tagged).cap;
                    if ((s->tagged).size == uVar1) {
                      iVar7 = (uVar1 >> 1) * 3;
                      if ((int)uVar1 < 4) {
                        iVar7 = uVar1 * 2;
                      }
                      piVar4 = (s->tagged).ptr;
                      if (piVar4 == (int *)0x0) {
                        piVar4 = (int *)malloc((long)iVar7 << 2);
                      }
                      else {
                        piVar4 = (int *)realloc(piVar4,(long)iVar7 << 2);
                      }
                      (s->tagged).ptr = piVar4;
                      if (piVar4 == (int *)0x0) {
                        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                               (double)(s->tagged).cap * 9.5367431640625e-07,
                               (double)iVar7 * 9.5367431640625e-07);
                        fflush(_stdout);
                      }
                      (s->tagged).cap = iVar7;
                    }
                    iVar7 = (s->tagged).size;
                    (s->tagged).size = iVar7 + 1;
                    (s->tagged).ptr[iVar7] = iVar5;
                  }
                  *(byte *)(s->vi + iVar5) = *(byte *)(s->vi + iVar5) & 0xc3 | 4;
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 < (uint)*cls >> 0xb);
            }
          }
        }
        lVar6 = lVar6 + -1;
      } while (*(s->trail_lim).ptr < lVar6);
    }
    iVar5 = (s->tagged).size;
    if (0 < iVar5) {
      piVar4 = (s->tagged).ptr;
      lVar6 = 0;
      do {
        *(byte *)(s->vi + piVar4[lVar6]) = *(byte *)(s->vi + piVar4[lVar6]) & 0xc3;
        lVar6 = lVar6 + 1;
        iVar5 = (s->tagged).size;
      } while (lVar6 < iVar5);
    }
    if (-1 < iVar5) {
      (s->tagged).size = 0;
      iVar5 = proof_chain_stop(s);
      return iVar5;
    }
  }
  __assert_fail("k <= v->size",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satVec.h"
                ,0x30,"void veci_resize(veci *, int)");
}

Assistant:

static int solver2_analyze_final(sat_solver2* s, clause* conf, int skip_first)
{
    int i, j, x;//, start;
    veci_resize(&s->conf_final,0);
    if ( s->root_level == 0 )
        return s->hProofLast;
    proof_chain_start( s, conf );
    assert( veci_size(&s->tagged) == 0 );
    clause_foreach_var( conf, x, i, skip_first ){
        if ( var_level(s,x) )
            var_set_tag(s, x, 1);
        else
            proof_chain_resolve( s, NULL, x );
    }
    assert( s->root_level >= veci_size(&s->trail_lim) );
//    start = (s->root_level >= veci_size(&s->trail_lim))? s->qtail-1 : (veci_begin(&s->trail_lim))[s->root_level];
    for (i = s->qtail-1; i >= (veci_begin(&s->trail_lim))[0]; i--){
        x = lit_var(s->trail[i]);
        if (var_tag(s,x)){
            clause* c = clause2_read(s, var_reason(s,x));
            if (c){
                proof_chain_resolve( s, c, x );
                clause_foreach_var( c, x, j, 1 ){
                    if ( var_level(s,x) )
                        var_set_tag(s, x, 1);
                    else
                        proof_chain_resolve( s, NULL, x );
                }
            }else {
                assert( var_level(s,x) );
                veci_push(&s->conf_final,lit_neg(s->trail[i]));
            }
        }
    }
    solver2_clear_tags(s,0);
    return proof_chain_stop( s );
}